

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O1

bool __thiscall SQGenerator::Yield(SQGenerator *this,SQVM *v,SQInteger target)

{
  SQObjectPtrVec *this_00;
  SQUnsignedInteger *pSVar1;
  long *plVar2;
  SQInstruction **ppSVar3;
  SQObjectType SVar4;
  SQObjectType SVar5;
  uint uVar6;
  uint uVar7;
  SQObjectPtr *pSVar8;
  SQTable *pSVar9;
  long lVar10;
  SQObjectPtr *pSVar11;
  long *plVar12;
  CallInfo *pCVar13;
  ulong uVar14;
  ulong uVar15;
  SQInteger SVar16;
  SQInteger SVar17;
  SQInteger SVar18;
  SQInt32 SVar19;
  SQInt32 SVar20;
  SQInt32 SVar21;
  SQInt32 SVar22;
  SQInt32 SVar23;
  undefined4 uVar24;
  SQObjectType SVar25;
  SQWeakRef *pSVar26;
  SQExceptionTrap *pSVar27;
  SQExceptionTrap *pSVar28;
  SQObjectValue SVar29;
  long lVar30;
  char *s;
  long lVar31;
  SQUnsignedInteger SVar32;
  SQUnsignedInteger SVar33;
  undefined1 auVar34 [16];
  SQObjectPtr local_40;
  
  if (this->_state == eDead) {
    s = "internal vm error, yielding a dead generator";
  }
  else {
    if (this->_state != eSuspended) {
      SVar33 = v->_top - v->_stackbase;
      this_00 = &this->_stack;
      local_40.super_SQObject._unVal.pTable = (SQTable *)0x0;
      local_40.super_SQObject._type = OT_NULL;
      sqvector<SQObjectPtr>::resize(this_00,SVar33,&local_40);
      SQObjectPtr::~SQObjectPtr(&local_40);
      pSVar8 = (v->_stack)._vals;
      SVar4 = pSVar8[v->_stackbase].super_SQObject._type;
      SVar29 = (SQObjectValue)pSVar8[v->_stackbase].super_SQObject._unVal.pRefCounted;
      SVar25 = SVar4;
      if ((SVar4 >> 0x1b & 1) != 0) {
        if (((SVar29.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._weakref ==
            (SQWeakRef *)0x0) {
          pSVar26 = (SQWeakRef *)sq_vm_malloc(0x28);
          (SVar29.pRefCounted)->_weakref = pSVar26;
          (pSVar26->super_SQRefCounted)._uiRef = 0;
          (pSVar26->super_SQRefCounted)._weakref = (SQWeakRef *)0x0;
          (pSVar26->super_SQRefCounted)._vptr_SQRefCounted =
               (_func_int **)&PTR__SQRefCounted_0013e8a0;
          pSVar26 = (SVar29.pRefCounted)->_weakref;
          (pSVar26->_obj)._type = SVar4;
          (pSVar26->_obj)._unVal.pRefCounted = (SQRefCounted *)SVar29;
        }
        SVar29 = (SQObjectValue)(SVar29.pRefCounted)->_weakref;
        local_40.super_SQObject._type = OT_WEAKREF;
        pSVar1 = &((SVar29.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef
        ;
        *pSVar1 = *pSVar1 + 1;
        SVar25 = OT_WEAKREF;
        local_40.super_SQObject._unVal = SVar29;
      }
      pSVar8 = this_00->_vals;
      SVar5 = (pSVar8->super_SQObject)._type;
      pSVar9 = (pSVar8->super_SQObject)._unVal.pTable;
      (pSVar8->super_SQObject)._unVal.pTable = (SQTable *)SVar29;
      (pSVar8->super_SQObject)._type = SVar25;
      if ((SVar25 >> 0x1b & 1) != 0) {
        pSVar1 = &(((pSVar8->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      if ((SVar5 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar9->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(pSVar9->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2]
          )();
        }
      }
      if ((SVar4 >> 0x1b & 1) != 0) {
        SQObjectPtr::~SQObjectPtr(&local_40);
      }
      if (1 < target) {
        lVar31 = target + -1;
        lVar30 = 0x18;
        do {
          lVar10 = v->_stackbase;
          pSVar8 = (v->_stack)._vals;
          pSVar11 = this_00->_vals;
          uVar6 = *(uint *)((long)pSVar11 + lVar30 + -8);
          plVar12 = *(long **)((long)&(pSVar11->super_SQObject)._type + lVar30);
          *(undefined8 *)((long)&(pSVar11->super_SQObject)._type + lVar30) =
               *(undefined8 *)((long)&pSVar8[lVar10].super_SQObject._type + lVar30);
          uVar7 = *(uint *)((long)pSVar8 + lVar30 + -8 + lVar10 * 0x10);
          *(uint *)((long)pSVar11 + lVar30 + -8) = uVar7;
          if ((uVar7 >> 0x1b & 1) != 0) {
            plVar2 = (long *)(*(long *)((long)&(pSVar11->super_SQObject)._type + lVar30) + 8);
            *plVar2 = *plVar2 + 1;
          }
          if ((uVar6 >> 0x1b & 1) != 0) {
            plVar2 = plVar12 + 1;
            *plVar2 = *plVar2 + -1;
            if (*plVar2 == 0) {
              (**(code **)(*plVar12 + 0x10))();
            }
          }
          lVar30 = lVar30 + 0x10;
          lVar31 = lVar31 + -1;
        } while (lVar31 != 0);
      }
      if (0 < (long)SVar33) {
        lVar30 = 8;
        do {
          lVar31 = v->_stackbase;
          pSVar8 = (v->_stack)._vals;
          plVar12 = *(long **)((long)&pSVar8[lVar31].super_SQObject._type + lVar30);
          uVar6 = *(uint *)((long)pSVar8 + lVar30 + -8 + lVar31 * 0x10);
          *(undefined4 *)((long)pSVar8 + lVar30 + -8 + lVar31 * 0x10) = 0x1000001;
          *(undefined8 *)((long)&pSVar8[lVar31].super_SQObject._type + lVar30) = 0;
          if ((uVar6 >> 0x1b & 1) != 0) {
            plVar2 = plVar12 + 1;
            *plVar2 = *plVar2 + -1;
            if (*plVar2 == 0) {
              (**(code **)(*plVar12 + 0x10))();
            }
          }
          lVar30 = lVar30 + 0x10;
          SVar33 = SVar33 - 1;
        } while (SVar33 != 0);
      }
      pCVar13 = v->ci;
      pSVar8 = pCVar13->_literals;
      (this->_ci)._ip = pCVar13->_ip;
      (this->_ci)._literals = pSVar8;
      SVar4 = (this->_ci)._closure.super_SQObject._type;
      pSVar9 = (this->_ci)._closure.super_SQObject._unVal.pTable;
      (this->_ci)._closure.super_SQObject._unVal = (pCVar13->_closure).super_SQObject._unVal;
      SVar25 = (pCVar13->_closure).super_SQObject._type;
      (this->_ci)._closure.super_SQObject._type = SVar25;
      if ((SVar25 >> 0x1b & 1) != 0) {
        pSVar1 = &(((this->_ci)._closure.super_SQObject._unVal.pTable)->super_SQDelegable).
                  super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      if ((SVar4 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar9->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(pSVar9->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2]
          )();
        }
      }
      SVar19 = pCVar13->_etraps;
      SVar20 = pCVar13->_prevstkbase;
      SVar21 = pCVar13->_prevtop;
      SVar22 = pCVar13->_target;
      SVar23 = pCVar13->_ncalls;
      uVar24 = *(undefined4 *)&pCVar13->field_0x3c;
      (this->_ci)._generator = pCVar13->_generator;
      (this->_ci)._etraps = SVar19;
      (this->_ci)._prevstkbase = SVar20;
      (this->_ci)._root = pCVar13->_root;
      (this->_ci)._prevtop = SVar21;
      (this->_ci)._target = SVar22;
      (this->_ci)._ncalls = SVar23;
      *(undefined4 *)&(this->_ci).field_0x3c = uVar24;
      (this->_ci)._generator = (SQGenerator *)0x0;
      if (0 < (this->_ci)._etraps) {
        lVar30 = 0;
        do {
          pSVar28 = (v->_etraps)._vals;
          SVar33 = (v->_etraps)._size;
          uVar14 = (this->_etraps)._size;
          uVar15 = (this->_etraps)._allocated;
          if (uVar15 <= uVar14) {
            SVar32 = uVar14 * 2;
            if (SVar32 == 0) {
              SVar32 = 4;
            }
            pSVar27 = (SQExceptionTrap *)
                      sq_vm_realloc((this->_etraps)._vals,uVar15 << 5,SVar32 << 5);
            (this->_etraps)._vals = pSVar27;
            (this->_etraps)._allocated = SVar32;
          }
          pSVar28 = pSVar28 + (SVar33 - 1);
          pSVar27 = (this->_etraps)._vals;
          SVar33 = (this->_etraps)._size;
          (this->_etraps)._size = SVar33 + 1;
          SVar16 = pSVar28->_stackbase;
          SVar17 = pSVar28->_stacksize;
          SVar18 = pSVar28->_extarget;
          ppSVar3 = &pSVar27[SVar33]._ip;
          *ppSVar3 = pSVar28->_ip;
          ppSVar3[1] = (SQInstruction *)SVar18;
          pSVar27 = pSVar27 + SVar33;
          pSVar27->_stackbase = SVar16;
          pSVar27->_stacksize = SVar17;
          pSVar1 = &(v->_etraps)._size;
          *pSVar1 = *pSVar1 - 1;
          pSVar27 = (this->_etraps)._vals;
          SVar33 = (this->_etraps)._size;
          pSVar28 = pSVar27 + (SVar33 - 1);
          lVar10 = pSVar28->_stacksize;
          lVar31 = v->_stackbase;
          auVar34._8_4_ = (int)lVar31;
          auVar34._0_8_ = lVar31;
          auVar34._12_4_ = (int)((ulong)lVar31 >> 0x20);
          pSVar27 = pSVar27 + (SVar33 - 1);
          pSVar27->_stackbase = pSVar28->_stackbase - lVar31;
          pSVar27->_stacksize = lVar10 - auVar34._8_8_;
          lVar30 = lVar30 + 1;
        } while (lVar30 < (this->_ci)._etraps);
      }
      this->_state = eSuspended;
      return true;
    }
    s = "internal vm error, yielding dead generator";
  }
  SQVM::Raise_Error(v,s);
  return false;
}

Assistant:

bool SQGenerator::Yield(SQVM *v,SQInteger target)
{
    if(_state==eSuspended) { v->Raise_Error(_SC("internal vm error, yielding dead generator"));  return false;}
    if(_state==eDead) { v->Raise_Error(_SC("internal vm error, yielding a dead generator")); return false; }
    SQInteger size = v->_top-v->_stackbase;

    _stack.resize(size);
    SQObject _this = v->_stack[v->_stackbase];
    _stack._vals[0] = ISREFCOUNTED(sq_type(_this)) ? SQObjectPtr(_refcounted(_this)->GetWeakRef(sq_type(_this))) : _this;
    for(SQInteger n =1; n<target; n++) {
        _stack._vals[n] = v->_stack[v->_stackbase+n];
    }
    for(SQInteger j =0; j < size; j++)
    {
        v->_stack[v->_stackbase+j].Null();
    }

    _ci = *v->ci;
    _ci._generator=NULL;
    for(SQInteger i=0;i<_ci._etraps;i++) {
        _etraps.push_back(v->_etraps.top());
        v->_etraps.pop_back();
        // store relative stack base and size in case of resume to other _top
        SQExceptionTrap &et = _etraps.back();
        et._stackbase -= v->_stackbase;
        et._stacksize -= v->_stackbase;
    }
    _state=eSuspended;
    return true;
}